

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * lest::with_message(text *__return_storage_ptr__,text *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  text *local_18;
  text *message_local;
  
  local_18 = message;
  message_local = __return_storage_ptr__;
  std::operator+(&local_38,"with message \"",message);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline text with_message( text message )
{
    return "with message \"" + message + "\"";
}